

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::RaceSuccessfulPromiseNodeBase::Branch::traceEvent(Branch *this,TraceBuilder *builder)

{
  PromiseNode *pPVar1;
  
  pPVar1 = (this->promise).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar1,builder,1);
  PromiseNode::OnReadyEvent::traceEvent(&this->parent->onReadyEvent,builder);
  return;
}

Assistant:

void RaceSuccessfulPromiseNodeBase::Branch::traceEvent(TraceBuilder &builder) {
  promise->tracePromise(builder, true);
  parent.onReadyEvent.traceEvent(builder);
}